

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_draw.cxx
# Opt level: O2

char * expand_text_(char *from,char **buf,int maxbuf,double maxw,int *n,double *width,int wrap,
                   int draw_symbols)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte *pbVar8;
  char *pcVar9;
  byte *pbVar10;
  size_t __size;
  double extraout_XMM0_Qa;
  double dVar11;
  double extraout_XMM0_Qa_00;
  byte *local_68;
  double local_60;
  
  pcVar9 = *buf + maxbuf;
  underline_at = (char *)0x0;
  if ((expand_text_(char_const*,char*&,int,double,int&,double&,int,int)::local_buf == '\0') &&
     (iVar2 = __cxa_guard_acquire(&expand_text_(char_const*,char*&,int,double,int&,double&,int,int)
                                   ::local_buf), iVar2 != 0)) {
    expand_text_::local_buf = (char *)malloc((long)expand_text_::l_local_buff);
    __cxa_guard_release(&expand_text_(char_const*,char*&,int,double,int&,double&,int,int)::local_buf
                       );
  }
  pbVar4 = (byte *)expand_text_::local_buf;
  if (maxbuf == 0) {
    *buf = expand_text_::local_buf;
    pcVar9 = (char *)pbVar4 + expand_text_::l_local_buff;
  }
  else {
    pbVar4 = (byte *)*buf;
  }
  pbVar10 = (byte *)(pcVar9 + -4);
  local_60 = 0.0;
  pbVar5 = pbVar4;
  pbVar7 = (byte *)from;
  do {
    bVar1 = *from;
    pbVar6 = pbVar5;
    if (((ulong)bVar1 < 0x21) && ((0x100000401U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      dVar11 = local_60;
      if ((wrap != 0) && (pbVar7 < from)) {
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x37])
                  (fl_graphics_driver,pbVar5,(ulong)(uint)((int)pbVar4 - (int)pbVar5));
        dVar11 = extraout_XMM0_Qa + local_60;
        pbVar6 = pbVar4;
        if ((*buf < pbVar5) && (pbVar8 = pbVar5, local_68 = pbVar7, maxw < dVar11))
        goto LAB_001e3e2e;
      }
      pbVar5 = pbVar6;
      pbVar8 = pbVar4;
      local_68 = (byte *)from;
      local_60 = dVar11;
      if (bVar1 == 0) goto LAB_001e3e2e;
      if (bVar1 == 10) {
        local_68 = (byte *)from + 1;
LAB_001e3e2e:
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x37])
                  (fl_graphics_driver,pbVar5,(ulong)(uint)((int)pbVar8 - (int)pbVar5));
        *width = extraout_XMM0_Qa_00 + local_60;
        *pbVar8 = 0;
        *n = (int)pbVar8 - *(int *)buf;
        return (char *)local_68;
      }
      pbVar7 = (byte *)from + 1;
    }
    pcVar9 = expand_text_::local_buf;
    if (pbVar10 < pbVar4) {
      pbVar5 = pbVar6;
      pbVar8 = pbVar4;
      local_68 = (byte *)from;
      if (maxbuf != 0) goto LAB_001e3e2e;
      expand_text_::l_local_buff = ((int)pbVar4 - (int)pbVar10) + expand_text_::l_local_buff + 200;
      __size = (size_t)expand_text_::l_local_buff;
      expand_text_::local_buf = (char *)realloc(expand_text_::local_buf,__size);
      *buf = expand_text_::local_buf;
      pbVar10 = (byte *)(expand_text_::local_buf + (__size - 4));
      pbVar4 = (byte *)(expand_text_::local_buf + ((long)pbVar4 - (long)pcVar9));
      pbVar6 = (byte *)(expand_text_::local_buf + ((long)pbVar6 - (long)pcVar9));
    }
    pbVar5 = pbVar6;
    if (bVar1 == 9) {
      iVar2 = fl_utf_nb_char((uchar *)*buf,(int)pbVar4 - (int)*buf);
      uVar3 = (long)iVar2 % 8 & 0xffffffff;
      for (; ((int)uVar3 < 8 && (pbVar4 < pbVar10)); pbVar4 = pbVar4 + 1) {
        *pbVar4 = 0x20;
        uVar3 = (ulong)((int)uVar3 + 1);
      }
    }
    else if ((fl_draw_shortcut == '\0' || bVar1 != 0x26) || (((byte *)from)[1] == 0)) {
      if (bVar1 < 0x20 || bVar1 == 0x7f) {
        *pbVar4 = 0x5e;
        pbVar4[1] = bVar1 ^ 0x40;
        pbVar4 = pbVar4 + 2;
      }
      else {
        if ((draw_symbols == 0) || (bVar1 != 0x40)) {
          *pbVar4 = bVar1;
          goto LAB_001e3e03;
        }
        pbVar8 = pbVar4;
        local_68 = (byte *)from;
        if ((((byte *)from)[1] & 0xbf) != 0) goto LAB_001e3e2e;
        *pbVar4 = 0x40;
        pbVar4 = pbVar4 + 1;
        if (((byte *)from)[1] != 0) {
          from = (char *)((byte *)from + 1);
        }
      }
    }
    else if (((byte *)from)[1] == 0x26) {
      from = (char *)((byte *)from + 1);
      *pbVar4 = 0x26;
LAB_001e3e03:
      pbVar4 = pbVar4 + 1;
    }
    else if (fl_draw_shortcut != '\x02') {
      underline_at = (char *)pbVar4;
    }
    from = (char *)((byte *)from + 1);
  } while( true );
}

Assistant:

static const char* expand_text_(const char* from, char*& buf, int maxbuf, double maxw, int& n,
	       double &width, int wrap, int draw_symbols) {
  char* e = buf+(maxbuf-4);
  underline_at = 0;
  double w = 0;
  static int l_local_buff = 500;
  static char *local_buf = (char*)malloc(l_local_buff); // initial buffer allocation
  if (maxbuf == 0) {
    buf = local_buf;
    e = buf + l_local_buff - 4;
    }
  char* o = buf;
  char* word_end = o;
  const char* word_start = from;

  const char* p = from;
  for (;; p++) {

    int c = *p & 255;

    if (!c || c == ' ' || c == '\n') {
      // test for word-wrap:
      if (word_start < p && wrap) {
	double newwidth = w + fl_width(word_end, (int) (o-word_end) );
	if (word_end > buf && newwidth > maxw) { // break before this word
	  o = word_end;
	  p = word_start;
	  break;
	}
	word_end = o;
	w = newwidth;
      }
      if (!c) break;
      else if (c == '\n') {p++; break;}
      word_start = p+1;
    }

    if (o > e) {
      if (maxbuf) break; // don't overflow buffer
      l_local_buff += (o - e) + 200; // enlarge buffer
      buf = (char*)realloc(local_buf, l_local_buff);
      e = buf + l_local_buff - 4; // update pointers to buffer content
      o = buf + (o - local_buf);
      word_end = buf + (word_end - local_buf);
      local_buf = buf;
    }

    if (c == '\t') {
      for (c = fl_utf_nb_char((uchar*)buf, (int) (o-buf) )%8; c<8 && o<e; c++)
           *o++ = ' ';
    } else if (c == '&' && fl_draw_shortcut && *(p+1)) {
      if (*(p+1) == '&') {p++; *o++ = '&';}
      else if (fl_draw_shortcut != 2) underline_at = o;
    } else if (c < ' ' || c == 127) { // ^X
      *o++ = '^';
      *o++ = c ^ 0x40;
/* This is in fact not useful: the point is that a valid UTF-8 sequence for a non-ascii char contains no ascii char,
 thus no tab, space, control, & or @ we want to process differently.
 Also, invalid UTF-8 sequences are copied unchanged by this procedure.
 Therefore, checking for tab, space, control, & or @, and copying the byte otherwise, is enough.
 } else  if (handle_utf8_seq(p, o)) { // figure out if we have an utf8 valid sequence before we determine the nbsp test validity:
#ifdef __APPLE__
    } else if (c == 0xCA) { // non-breaking space in MacRoman
#else
    } else if (c == 0xA0) { // non-breaking space in ISO 8859
#endif
      *o++ = ' ';*/
    } else if (c == '@' && draw_symbols) { // Symbol???
      if (p[1] && p[1] != '@')  break;
      *o++ = c;
      if (p[1]) p++;
    } else {
      *o++ = c;
    }
  }

  width = w + fl_width(word_end, (int) (o-word_end));
  *o = 0;
  n = (int) (o-buf);
  return p;
}